

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

int ncnn_extractor_extract(ncnn_extractor_t ex,char *name,ncnn_mat_t *mat)

{
  int *piVar1;
  int iVar2;
  ncnn_mat_t p_Var3;
  Mat mat0;
  Mat local_58;
  
  local_58.cstep = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.elemsize._0_4_ = 0;
  local_58.elemsize._4_4_ = 0;
  local_58.elempack = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.d = 0;
  local_58.c = 0;
  iVar2 = ncnn::Extractor::extract((Extractor *)ex,name,&local_58,0);
  p_Var3 = (ncnn_mat_t)operator_new(0x48);
  *(void **)p_Var3 = local_58.data;
  piVar1 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  *(int **)(p_Var3 + 8) = piVar1;
  *(ulong *)(p_Var3 + 0x10) = CONCAT44(local_58.elemsize._4_4_,(undefined4)local_58.elemsize);
  *(int *)(p_Var3 + 0x18) = local_58.elempack;
  *(Allocator **)(p_Var3 + 0x20) = local_58.allocator;
  *(int *)(p_Var3 + 0x28) = local_58.dims;
  *(int *)(p_Var3 + 0x2c) = local_58.w;
  *(int *)(p_Var3 + 0x30) = local_58.h;
  *(int *)(p_Var3 + 0x34) = local_58.d;
  *(int *)(p_Var3 + 0x38) = local_58.c;
  *(size_t *)(p_Var3 + 0x40) = local_58.cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  *mat = p_Var3;
  piVar1 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (*(local_58.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int ncnn_extractor_extract(ncnn_extractor_t ex, const char* name, ncnn_mat_t* mat)
{
    Mat mat0;
    int ret = ((Extractor*)ex)->extract(name, mat0);
    *mat = (ncnn_mat_t)(new Mat(mat0));
    return ret;
}